

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void base_unmap(tsdn_t *tsdn,extent_hooks_t *extent_hooks,uint ind,void *addr,size_t size)

{
  _Bool _Var1;
  ulong uVar2;
  void *in_RCX;
  uint in_EDX;
  extent_hooks_t *in_RSI;
  tsd_t *in_RDI;
  size_t in_R8;
  long *in_FS_OFFSET;
  tsd_t *tsd;
  tsd_t *tsd_1;
  tsd_t *in_stack_ffffffffffffff88;
  tsd_t *in_stack_ffffffffffffff90;
  
  if ((in_RSI != &extent_hooks_default) ||
     ((((_Var1 = extent_dalloc_mmap(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88),
        _Var1 && (_Var1 = pages_decommit(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88
                                        ), _Var1)) &&
       (_Var1 = pages_purge_forced(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88),
       _Var1)) && (_Var1 = pages_purge_lazy(in_stack_ffffffffffffff88,0x128a51), _Var1)))) {
    if ((in_RDI == (tsd_t *)0x0) &&
       (in_RDI = (tsd_t *)*in_FS_OFFSET, (((tsd_t *)*in_FS_OFFSET)->state).repr != '\0')) {
      in_RDI = tsd_fetch_slow(in_stack_ffffffffffffff90,
                              SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
    }
    in_stack_ffffffffffffff88 = in_RDI;
    in_stack_ffffffffffffff90 = in_stack_ffffffffffffff88;
    pre_reentrancy(in_stack_ffffffffffffff88,(arena_t *)in_stack_ffffffffffffff88);
    if ((((in_RSI->dalloc == (extent_dalloc_t *)0x0) ||
         (_Var1 = (*in_RSI->dalloc)(in_RSI,in_RCX,in_R8,true,in_EDX), _Var1)) &&
        ((in_RSI->decommit == (undefined1 *)0x0 ||
         (uVar2 = (*(code *)in_RSI->decommit)(in_RSI,in_RCX,in_R8,0,in_R8,in_EDX), (uVar2 & 1) != 0)
         ))) && (((in_RSI->purge_forced == (undefined1 *)0x0 ||
                  (uVar2 = (*(code *)in_RSI->purge_forced)(in_RSI,in_RCX,in_R8,0,in_R8,in_EDX),
                  (uVar2 & 1) != 0)) && (in_RSI->purge_lazy != (undefined1 *)0x0)))) {
      (*(code *)in_RSI->purge_lazy)(in_RSI,in_RCX,in_R8,0,in_R8,in_EDX);
    }
    post_reentrancy(in_stack_ffffffffffffff90);
  }
  _Var1 = metadata_thp_madvise();
  if (_Var1) {
    pages_nohuge(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

static void
base_unmap(tsdn_t *tsdn, extent_hooks_t *extent_hooks, unsigned ind, void *addr,
    size_t size) {
	/*
	 * Cascade through dalloc, decommit, purge_forced, and purge_lazy,
	 * stopping at first success.  This cascade is performed for consistency
	 * with the cascade in extent_dalloc_wrapper() because an application's
	 * custom hooks may not support e.g. dalloc.  This function is only ever
	 * called as a side effect of arena destruction, so although it might
	 * seem pointless to do anything besides dalloc here, the application
	 * may in fact want the end state of all associated virtual memory to be
	 * in some consistent-but-allocated state.
	 */
	if (extent_hooks == &extent_hooks_default) {
		if (!extent_dalloc_mmap(addr, size)) {
			goto label_done;
		}
		if (!pages_decommit(addr, size)) {
			goto label_done;
		}
		if (!pages_purge_forced(addr, size)) {
			goto label_done;
		}
		if (!pages_purge_lazy(addr, size)) {
			goto label_done;
		}
		/* Nothing worked.  This should never happen. */
		not_reached();
	} else {
		tsd_t *tsd = tsdn_null(tsdn) ? tsd_fetch() : tsdn_tsd(tsdn);
		pre_reentrancy(tsd, NULL);
		if (extent_hooks->dalloc != NULL &&
		    !extent_hooks->dalloc(extent_hooks, addr, size, true,
		    ind)) {
			goto label_post_reentrancy;
		}
		if (extent_hooks->decommit != NULL &&
		    !extent_hooks->decommit(extent_hooks, addr, size, 0, size,
		    ind)) {
			goto label_post_reentrancy;
		}
		if (extent_hooks->purge_forced != NULL &&
		    !extent_hooks->purge_forced(extent_hooks, addr, size, 0,
		    size, ind)) {
			goto label_post_reentrancy;
		}
		if (extent_hooks->purge_lazy != NULL &&
		    !extent_hooks->purge_lazy(extent_hooks, addr, size, 0, size,
		    ind)) {
			goto label_post_reentrancy;
		}
		/* Nothing worked.  That's the application's problem. */
	label_post_reentrancy:
		post_reentrancy(tsd);
	}
label_done:
	if (metadata_thp_madvise()) {
		/* Set NOHUGEPAGE after unmap to avoid kernel defrag. */
		assert(((uintptr_t)addr & HUGEPAGE_MASK) == 0 &&
		    (size & HUGEPAGE_MASK) == 0);
		pages_nohuge(addr, size);
	}
}